

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O2

void __thiscall z80::z80(z80 *this,OpCode o,Operand *o1,Operand *o2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 in_register_00000034;
  string local_50;
  
  to_string_abi_cxx11_(&local_50,(z80 *)CONCAT44(in_register_00000034,o),(OpCode)o1);
  (this->super_ASMLine).type = Instruction;
  paVar1 = &(this->super_ASMLine).text.field_2;
  (this->super_ASMLine).text._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_ASMLine).text.field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (this->super_ASMLine).text._M_dataplus._M_p = local_50._M_dataplus._M_p;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  }
  (this->super_ASMLine).text._M_string_length = local_50._M_string_length;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::~string((string *)&local_50);
  this->opcode = o;
  Operand::Operand(&this->op1,o1);
  Operand::Operand(&this->op2,o2);
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  (this->comment)._M_string_length = 0;
  (this->comment).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

z80(const OpCode o, const Operand o1, const Operand o2)
	: ASMLine(Type::Instruction, to_string(o))
		, opcode(o), op1(o1), op2(o2)
	{}